

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

size_t __thiscall NULLCString::strlen(NULLCString *this,char *__s)

{
  char *pcVar1;
  uint i;
  ulong uVar2;
  
  if (this == (NULLCString *)0x0) {
    pcVar1 = "second string is null";
  }
  else {
    pcVar1 = "second string is not null-terminated";
    for (uVar2 = 0; (int)__s != (int)uVar2; uVar2 = (ulong)((int)uVar2 + 1)) {
      if (this[uVar2] == (NULLCString)0x0) {
        return uVar2;
      }
    }
  }
  nullcThrowError(pcVar1 + 7);
  return 0xffffffffffffffff;
}

Assistant:

int strlen(NULLCArray string)
	{
		if(!string.ptr)
		{
			nullcThrowError("string is null");
			return -1;
		}

		for(unsigned i = 0; i < string.len; i++)
		{
			if(!string.ptr[i])
				return i;
		}

		nullcThrowError("string is not null-terminated");
		return -1;
	}